

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O1

bool __thiscall
QAuthenticatorPrivate::isMethodSupported(QAuthenticatorPrivate *this,QByteArrayView method)

{
  bool bVar1;
  void *pvVar2;
  QAuthenticatorPrivate *pQVar3;
  char *b;
  storage_type *__s;
  long in_FS_OFFSET;
  _Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_network_kernel_qauthenticator_cpp:419:30)>
  local_28;
  long local_18;
  
  __s = (storage_type *)method.m_size;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((long)this < 1) {
LAB_001a4906:
    pQVar3 = (QAuthenticatorPrivate *)0xffffffffffffffff;
  }
  else {
    pvVar2 = memchr(__s,0x20,(size_t)this);
    if (pvVar2 == (void *)0x0) goto LAB_001a4906;
    pQVar3 = (QAuthenticatorPrivate *)((long)pvVar2 - (long)__s);
  }
  local_28._M_pred.method.m_size = (qsizetype)this;
  if (pQVar3 != (QAuthenticatorPrivate *)0xffffffffffffffff) {
    local_28._M_pred.method.m_size = (qsizetype)pQVar3;
  }
  local_28._M_pred.method.m_data = __s;
  bVar1 = __gnu_cxx::__ops::
          _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/network/kernel/qauthenticator.cpp:419:30)>
          ::operator()<const_char_(*)[10]>(&local_28,isMethodSupported::methods);
  if (!bVar1) {
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/network/kernel/qauthenticator.cpp:419:30)>
            ::operator()<const_char_(*)[10]>(&local_28,isMethodSupported::methods + 1);
    if (!bVar1) {
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/network/kernel/qauthenticator.cpp:419:30)>
              ::operator()<const_char_(*)[10]>(&local_28,isMethodSupported::methods + 2);
      if (!bVar1) {
        bVar1 = __gnu_cxx::__ops::
                _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/network/kernel/qauthenticator.cpp:419:30)>
                ::operator()<const_char_(*)[10]>(&local_28,isMethodSupported::methods + 3);
        if (!bVar1) {
          bVar1 = false;
          goto LAB_001a496a;
        }
      }
    }
  }
  bVar1 = true;
LAB_001a496a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QAuthenticatorPrivate::isMethodSupported(QByteArrayView method)
{
    Q_ASSERT(!method.startsWith(' ')); // This should be trimmed during parsing
    auto separator = method.indexOf(' ');
    if (separator != -1)
        method = method.first(separator);
    const auto isSupported = [method](QByteArrayView reference) {
        return method.compare(reference, Qt::CaseInsensitive) == 0;
    };
    static const char methods[][10] = {
        "basic",
        "ntlm",
        "digest",
#if QT_CONFIG(sspi) || QT_CONFIG(gssapi)
        "negotiate",
#endif
    };
    return std::any_of(methods, methods + std::size(methods), isSupported);
}